

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Token * __thiscall toml::internal::Lexer::nextStringSingleQuote(Lexer *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  Token *in_RDI;
  char c;
  string s;
  undefined7 in_stack_fffffffffffffed0;
  char in_stack_fffffffffffffed7;
  Lexer *in_stack_fffffffffffffed8;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee4;
  undefined1 in_stack_fffffffffffffee5;
  undefined1 in_stack_fffffffffffffee6;
  undefined1 in_stack_fffffffffffffee7;
  undefined8 in_stack_fffffffffffffee8;
  TokenType TVar7;
  string *this_00;
  undefined6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [36];
  undefined4 local_94;
  string local_90 [39];
  char local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  bVar1 = consume(in_stack_fffffffffffffed8,in_stack_fffffffffffffed7);
  TVar7 = (TokenType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  if (bVar1) {
    std::__cxx11::string::string(local_68);
    uVar2 = current(in_stack_fffffffffffffed8,
                    (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    if (((bool)uVar2) && (local_69 == '\'')) {
      next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      uVar3 = current(in_stack_fffffffffffffed8,
                      (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      if (((bool)uVar3) && (local_69 == '\'')) {
        next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        uVar4 = current(in_stack_fffffffffffffed8,
                        (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        if (((bool)uVar4) && (local_69 == '\n')) {
          next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        }
        while( true ) {
          uVar5 = current(in_stack_fffffffffffffed8,
                          (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
          TVar7 = (TokenType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
          if (!(bool)uVar5) break;
          if (local_69 == '\'') {
            next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
            in_stack_fffffffffffffee5 =
                 current(in_stack_fffffffffffffed8,
                         (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
            if (((bool)in_stack_fffffffffffffee5) && (local_69 == '\'')) {
              next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
              in_stack_fffffffffffffee4 =
                   current(in_stack_fffffffffffffed8,
                           (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
              TVar7 = (TokenType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
              if (((bool)in_stack_fffffffffffffee4) && (local_69 == '\'')) {
                next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
                Token::Token((Token *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffef0)),
                             TVar7,(string *)
                                   CONCAT17(uVar4,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffee5,
                                                                          CONCAT14(
                                                  in_stack_fffffffffffffee4,
                                                  in_stack_fffffffffffffee0)))));
                goto LAB_0017fcca;
              }
              std::__cxx11::string::operator+=(local_68,'\'');
              std::__cxx11::string::operator+=(local_68,'\'');
            }
            else {
              std::__cxx11::string::operator+=(local_68,'\'');
            }
          }
          else {
            next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
            std::__cxx11::string::operator+=(local_68,local_69);
          }
        }
        paVar6 = &local_b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b8,"string didn\'t end with \'\'\'\'\' ?",paVar6);
        Token::Token((Token *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffef0)),TVar7,
                     (string *)
                     CONCAT17(uVar4,CONCAT16(uVar5,CONCAT15(in_stack_fffffffffffffee5,
                                                            CONCAT14(in_stack_fffffffffffffee4,
                                                                     in_stack_fffffffffffffee0)))));
        std::__cxx11::string::~string(local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
      }
      else {
        this_00 = local_90;
        std::__cxx11::string::string(this_00);
        Token::Token((Token *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffffef0)),
                     (TokenType)((ulong)this_00 >> 0x20),
                     (string *)
                     CONCAT17(in_stack_fffffffffffffee7,
                              CONCAT16(in_stack_fffffffffffffee6,
                                       CONCAT15(in_stack_fffffffffffffee5,
                                                CONCAT14(in_stack_fffffffffffffee4,
                                                         in_stack_fffffffffffffee0)))));
        std::__cxx11::string::~string(local_90);
      }
    }
    else {
      while( true ) {
        in_stack_fffffffffffffed7 =
             current(in_stack_fffffffffffffed8,
                     (char *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        TVar7 = (TokenType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
        if (!(bool)in_stack_fffffffffffffed7) break;
        next((Lexer *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
        if (local_69 == '\'') {
          Token::Token((Token *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                        in_stack_fffffffffffffef0)),
                       (TokenType)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                       (string *)
                       CONCAT17(in_stack_fffffffffffffee7,
                                CONCAT16(in_stack_fffffffffffffee6,
                                         CONCAT15(in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))));
          goto LAB_0017fcca;
        }
        std::__cxx11::string::operator+=(local_68,local_69);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,"string didn\'t end with \'\'\'?",&local_e1);
      Token::Token((Token *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffef6,
                                                    in_stack_fffffffffffffef0)),TVar7,
                   (string *)
                   CONCAT17(in_stack_fffffffffffffee7,
                            CONCAT16(in_stack_fffffffffffffee6,
                                     CONCAT15(in_stack_fffffffffffffee5,
                                              CONCAT14(in_stack_fffffffffffffee4,
                                                       in_stack_fffffffffffffee0)))));
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    }
LAB_0017fcca:
    local_94 = 1;
    std::__cxx11::string::~string(local_68);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"string didn\'t start with \'\'\'?",&local_31);
    Token::Token((Token *)CONCAT17(in_stack_fffffffffffffef7,
                                   CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                 TVar7,(string *)
                       CONCAT17(in_stack_fffffffffffffee7,
                                CONCAT16(in_stack_fffffffffffffee6,
                                         CONCAT15(in_stack_fffffffffffffee5,
                                                  CONCAT14(in_stack_fffffffffffffee4,
                                                           in_stack_fffffffffffffee0)))));
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return in_RDI;
}

Assistant:

inline Token Lexer::nextStringSingleQuote()
{
    if (!consume('\''))
        return Token(TokenType::ERROR_TOKEN, std::string("string didn't start with '\''?"));

    std::string s;
    char c;

    if (current(&c) && c == '\'') {
        next();
        if (!current(&c) || c != '\'') {
            // OK. It's empty string.
            return Token(TokenType::STRING, std::string());
        }
        next();
        // raw string literal started.
        // Newline just after """ should be ignored.
        if (current(&c) && c == '\n')
            next();

        while (current(&c)) {
            if (c == '\'') {
                next();
                if (current(&c) && c == '\'') {
                    next();
                    if (current(&c) && c == '\'') {
                        next();
                        return Token(TokenType::MULTILINE_STRING, s);
                    } else {
                        s += '\'';
                        s += '\'';
                        continue;
                    }
                } else {
                    s += '\'';
                    continue;
                }
            }

            next();
            s += c;
            continue;
        }

        return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\'\'\'' ?"));
    }

    while (current(&c)) {
        next();
        if (c == '\'') {
            return Token(TokenType::STRING, s);
        }

        s += c;
    }

    return Token(TokenType::ERROR_TOKEN, std::string("string didn't end with '\''?"));
}